

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O1

REF_STATUS
ref_mpi_allconcat(REF_MPI ref_mpi,REF_INT ldim,REF_INT my_size,void *my_array,REF_INT *total_size,
                 REF_INT **source,void **concatenated,REF_TYPE type)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  REF_INT *counts;
  long lVar5;
  REF_INT *pRVar6;
  void *pvVar7;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  long lVar11;
  REF_MPI ref_mpi_00;
  char *pcVar12;
  REF_STATUS RVar13;
  
  if ((long)ref_mpi->n < 0) {
    pcVar12 = "malloc counts of REF_INT negative";
    uVar9 = 0x3da;
LAB_002305cd:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar9,
           "ref_mpi_allconcat",pcVar12);
    RVar13 = 1;
  }
  else {
    counts = (REF_INT *)malloc((long)ref_mpi->n << 2);
    if (counts == (REF_INT *)0x0) {
      pcVar12 = "malloc counts of REF_INT NULL";
      uVar9 = 0x3da;
    }
    else {
      *counts = my_size;
      *total_size = 0;
      if (0 < ref_mpi->n) {
        lVar5 = 0;
        do {
          *total_size = *total_size + counts[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 < ref_mpi->n);
      }
      iVar1 = *total_size;
      lVar5 = (long)iVar1;
      if (lVar5 < 0) {
        pcVar12 = "malloc *source of REF_INT negative";
        uVar9 = 0x3e1;
        goto LAB_002305cd;
      }
      pRVar6 = (REF_INT *)malloc(lVar5 * 4);
      *source = pRVar6;
      if (pRVar6 == (REF_INT *)0x0) {
        pcVar12 = "malloc *source of REF_INT NULL";
        uVar9 = 0x3e1;
      }
      else {
        iVar2 = ref_mpi->n;
        iVar10 = 0;
        if (0 < (long)iVar2) {
          lVar8 = 0;
          iVar10 = 0;
          do {
            iVar3 = counts[lVar8];
            if (0 < iVar3) {
              lVar11 = 0;
              do {
                pRVar6[iVar10 + lVar11] = (REF_INT)lVar8;
                lVar11 = lVar11 + 1;
              } while (iVar3 != (int)lVar11);
              iVar10 = iVar10 + (int)lVar11;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != iVar2);
        }
        if (iVar1 != iVar10) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",
                 1000,"ref_mpi_allconcat","count mismatch",lVar5,(long)iVar10);
        }
        if (iVar1 != iVar10) {
          return (uint)(iVar1 != iVar10);
        }
        if (type == 3) {
          if (*total_size * ldim < 0) {
            pcVar12 = "malloc *((REF_DBL **)concatenated) of REF_DBL negative";
            uVar9 = 0x3ef;
            goto LAB_002305cd;
          }
          ref_mpi_00 = (REF_MPI)((ulong)(uint)(*total_size * ldim) << 3);
          pvVar7 = malloc((size_t)ref_mpi_00);
          *concatenated = pvVar7;
          if (pvVar7 != (void *)0x0) goto LAB_00230643;
          pcVar12 = "malloc *((REF_DBL **)concatenated) of REF_DBL NULL";
          uVar9 = 0x3ef;
        }
        else {
          if (type != 1) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",
                   0x3f2,"ref_mpi_allconcat",6,"data type");
            return 6;
          }
          if (*total_size * ldim < 0) {
            pcVar12 = "malloc *((REF_INT **)concatenated) of REF_INT negative";
            uVar9 = 0x3ec;
            goto LAB_002305cd;
          }
          ref_mpi_00 = (REF_MPI)((ulong)(uint)(*total_size * ldim) << 2);
          pvVar7 = malloc((size_t)ref_mpi_00);
          *concatenated = pvVar7;
          if (pvVar7 != (void *)0x0) {
LAB_00230643:
            iVar1 = ref_mpi->n;
            if (0 < (long)iVar1) {
              lVar5 = 0;
              do {
                counts[lVar5] = counts[lVar5] * ldim;
                lVar5 = lVar5 + 1;
              } while (iVar1 != lVar5);
            }
            uVar4 = ref_mpi_allgatherv(ref_mpi_00,my_array,counts,*concatenated,type);
            if (uVar4 == 0) {
              free(counts);
              return 0;
            }
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",
                   0x3f9,"ref_mpi_allconcat",(ulong)uVar4,"gather values");
            return uVar4;
          }
          pcVar12 = "malloc *((REF_INT **)concatenated) of REF_INT NULL";
          uVar9 = 0x3ec;
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar9,
           "ref_mpi_allconcat",pcVar12);
    RVar13 = 2;
  }
  return RVar13;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_allconcat(REF_MPI ref_mpi, REF_INT ldim,
                                     REF_INT my_size, void *my_array,
                                     REF_INT *total_size, REF_INT **source,
                                     void **concatenated, REF_TYPE type) {
  REF_INT proc, i, tot;
  REF_INT *counts;

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, (void *)(&my_size), (void *)counts,
                        REF_INT_TYPE),
      "gather size");

  *total_size = 0;
  each_ref_mpi_part(ref_mpi, proc)(*total_size) += counts[proc];
  ref_malloc(*source, *total_size, REF_INT);

  tot = 0;
  each_ref_mpi_part(ref_mpi, proc) for (i = 0; i < counts[proc]; i++) {
    (*source)[tot] = proc;
    tot++;
  }
  REIS(*total_size, tot, "count mismatch");

  switch (type) {
    case REF_INT_TYPE:
      ref_malloc(*((REF_INT **)concatenated), ldim * (*total_size), REF_INT);
      break;
    case REF_DBL_TYPE:
      ref_malloc(*((REF_DBL **)concatenated), ldim * (*total_size), REF_DBL);
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }

  /* pad ldim */
  each_ref_mpi_part(ref_mpi, proc) counts[proc] *= ldim;

  RSS(ref_mpi_allgatherv(ref_mpi, my_array, counts, *concatenated, type),
      "gather values");

  ref_free(counts);

  return REF_SUCCESS;
}